

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.hpp
# Opt level: O0

void __thiscall
asio::detail::object_pool<asio::detail::epoll_reactor::descriptor_state>::~object_pool
          (object_pool<asio::detail::epoll_reactor::descriptor_state> *this)

{
  object_pool<asio::detail::epoll_reactor::descriptor_state> *in_RDI;
  descriptor_state *in_stack_ffffffffffffffe8;
  
  destroy_list(in_RDI,in_stack_ffffffffffffffe8);
  destroy_list(in_RDI,in_stack_ffffffffffffffe8);
  noncopyable::~noncopyable((noncopyable *)in_RDI);
  return;
}

Assistant:

~object_pool()
  {
    destroy_list(live_list_);
    destroy_list(free_list_);
  }